

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

int __thiscall CInput::Update(CInput *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  SDL_Event *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int CompositionEnd;
  int i;
  int Action;
  int Scancode;
  int Key;
  Uint8 *pState;
  int NumKeyStates;
  SDL_Event Event;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar4;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  uint uVar5;
  int iVar6;
  SDL_Event *this_00;
  int local_48;
  int local_44;
  int local_40 [2];
  SDL_SysWMmsg *local_38;
  undefined4 local_30;
  int local_2c;
  int local_14;
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(int *)((long)in_RDI + 0x1ca0) = *(int *)((long)in_RDI + 0x1ca0) % 0xffff + 1;
  this_00 = in_RDI;
  SDL_GetKeyboardState(&local_44);
  if (0x19a < local_44) {
    local_44 = 0x19b;
  }
  mem_copy((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  mem_zero((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
           in_stack_ffffffffffffff7c);
  UpdateMouseState((CInput *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  UpdateJoystickState((CInput *)&this_00->common);
  do {
    iVar1 = SDL_PollEvent(local_40);
    if (iVar1 == 0) {
      if (*(int *)((long)in_RDI + 0x1284) == 0) {
        *(undefined4 *)((long)in_RDI + 0x1284) = 0xffffffff;
      }
      local_48 = 0;
LAB_0013458d:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_48;
    }
    iVar6 = -1;
    iVar1 = -1;
    uVar5 = 1;
    if (local_40[0] == 0x100) {
      local_48 = 1;
      goto LAB_0013458d;
    }
    iVar4 = local_40[0];
    if (local_40[0] == 0x201) {
      ProcessSystemMessage((CInput *)&in_RDI->common,local_38);
      goto LAB_001344e5;
    }
    if (local_40[0] == 0x300) {
LAB_00134332:
      iVar6 = KeycodeToKey(local_2c);
      iVar1 = local_30;
    }
    else {
      if (local_40[0] == 0x301) {
        uVar5 = 0;
        goto LAB_00134332;
      }
      if (local_40[0] == 0x302) {
        iVar2 = str_length((char *)0x1341bb);
        *(int *)((long)in_RDI + 0x1284) = iVar2;
        if (*(int *)((long)in_RDI + 0x1284) == 0) {
          *(undefined1 *)((long)in_RDI + 0x1259) = 0;
          *(undefined4 *)((long)in_RDI + 0x1284) = 0;
          *(undefined4 *)((long)in_RDI + 0x127c) = 0;
          *(undefined4 *)((long)in_RDI + 0x1280) = 0;
        }
        else {
          str_copy((char *)CONCAT44(iVar4,in_stack_ffffffffffffff80),
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
          *(undefined4 *)((long)in_RDI + 0x127c) = 0;
          for (in_stack_ffffffffffffff98 = 0; in_stack_ffffffffffffff98 < local_14;
              in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1) {
            iVar2 = str_utf8_forward((char *)((long)in_RDI + 0x1259),*(int *)((long)in_RDI + 0x127c)
                                    );
            *(int *)((long)in_RDI + 0x127c) = iVar2;
          }
          in_stack_ffffffffffffff94 = *(int *)((long)in_RDI + 0x127c);
          for (in_stack_ffffffffffffff90 = 0; in_stack_ffffffffffffff90 < local_10;
              in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90 + 1) {
            in_stack_ffffffffffffff94 =
                 str_utf8_forward((char *)((long)in_RDI + 0x1259),in_stack_ffffffffffffff94);
          }
          *(int *)((long)in_RDI + 0x1280) =
               in_stack_ffffffffffffff94 - *(int *)((long)in_RDI + 0x127c);
          AddEvent((CInput *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (char *)in_RDI->padding,iVar4,in_stack_ffffffffffffff80);
        }
      }
      else if (local_40[0] == 0x303) {
        *(undefined1 *)((long)in_RDI + 0x1259) = 0;
        *(undefined4 *)((long)in_RDI + 0x1284) = 0xffffffff;
        *(undefined4 *)((long)in_RDI + 0x127c) = 0;
        *(undefined4 *)((long)in_RDI + 0x1280) = 0;
        AddEvent((CInput *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (char *)in_RDI->padding,0x303,in_stack_ffffffffffffff80);
      }
      else {
        if (local_40[0] != 0x401) {
          if (local_40[0] != 0x402) {
            if (local_40[0] == 0x403) {
              if (local_2c < 1) {
                if (-1 < local_2c) goto LAB_001344e5;
                iVar1 = 0x1a5;
              }
              else {
                iVar1 = 0x1a4;
              }
              uVar5 = 3;
              iVar6 = iVar1;
            }
            else if (local_40[0] == 0x600) {
              HandleJoystickAxisMotionEvent
                        ((CInput *)0xffffffffffffffff,
                         (SDL_Event *)CONCAT44(1,in_stack_ffffffffffffff98));
            }
            else if (local_40[0] == 0x602) {
              HandleJoystickHatMotionEvent
                        ((CInput *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_RDI);
            }
            else if (local_40[0] - 0x603U < 2) {
              HandleJoystickButtonEvent
                        ((CInput *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         in_RDI);
            }
            goto LAB_001344e5;
          }
          uVar5 = 0;
        }
        if ((char)local_30 == '\x01') {
          iVar1 = 0x19b;
          iVar6 = iVar1;
          if ((uint)local_30._2_1_ % 2 == 0) {
            *(undefined1 *)((long)in_RDI + 0x1258) = 1;
          }
          else if (local_30._2_1_ == 1) {
            *(undefined1 *)((long)in_RDI + 0x1258) = 0;
          }
        }
        else if ((char)local_30 == '\x03') {
          iVar1 = 0x19c;
          iVar6 = 0x19c;
        }
        else if ((char)local_30 == '\x02') {
          iVar1 = 0x19d;
          iVar6 = 0x19d;
        }
        else if ((char)local_30 == '\x04') {
          iVar1 = 0x19e;
          iVar6 = 0x19e;
        }
        else if ((char)local_30 == '\x05') {
          iVar1 = 0x19f;
          iVar6 = 0x19f;
        }
        else if ((char)local_30 == '\x06') {
          iVar1 = 0x1a0;
          iVar6 = 0x1a0;
        }
        else if ((char)local_30 == '\a') {
          iVar1 = 0x1a1;
          iVar6 = 0x1a1;
        }
        else if ((char)local_30 == '\b') {
          iVar1 = 0x1a2;
          iVar6 = 0x1a2;
        }
        else {
          iVar1 = iVar6;
          if ((char)local_30 == '\t') {
            iVar1 = 0x1a3;
            iVar6 = iVar1;
          }
        }
      }
    }
LAB_001344e5:
    if ((-1 < iVar6) && (uVar3 = (**(code **)((long)in_RDI->common + 0x90))(), (uVar3 & 1) == 0)) {
      if (((uVar5 & 1) != 0) && (((iVar6 < 0x200 && (-1 < iVar1)) && (iVar1 < 0x200)))) {
        in_RDI->padding[(long)iVar1 + 0x1aa0] = '\x01';
        *(short *)((long)in_RDI + (long)iVar6 * 2 + 0x16a0) =
             (short)*(undefined4 *)((long)in_RDI + 0x1ca0);
      }
      AddEvent((CInput *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_RDI->padding,iVar4,in_stack_ffffffffffffff80);
    }
  } while( true );
}

Assistant:

int CInput::Update()
{
	// keep the counter between 1..0xFFFF, 0 means not pressed
	m_InputCounter = (m_InputCounter%0xFFFF)+1;

	int NumKeyStates;
	const Uint8 *pState = SDL_GetKeyboardState(&NumKeyStates);
	if(NumKeyStates >= KEY_MOUSE_1)
		NumKeyStates = KEY_MOUSE_1;
	mem_copy(m_aInputState, pState, NumKeyStates);
	mem_zero(m_aInputState+NumKeyStates, KEY_LAST-NumKeyStates);

	// these states must always be updated manually because they are not in the SDL_GetKeyboardState from SDL
	UpdateMouseState();
	UpdateJoystickState();

	SDL_Event Event;
	while(SDL_PollEvent(&Event))
	{
		int Key = -1;
		int Scancode = -1;
		int Action = IInput::FLAG_PRESS;
		switch(Event.type)
		{
			// handle text editing candidate
			case SDL_SYSWMEVENT:
				ProcessSystemMessage(Event.syswm.msg);
				break;

			// handle on the spot text editing
			case SDL_TEXTEDITING:
			{
				m_CompositionLength = str_length(Event.edit.text);
				if(m_CompositionLength)
				{
					str_copy(m_aComposition, Event.edit.text, sizeof(m_aComposition));
					m_CompositionCursor = 0;
					for(int i = 0; i < Event.edit.start; i++)
						m_CompositionCursor = str_utf8_forward(m_aComposition, m_CompositionCursor);
					int CompositionEnd = m_CompositionCursor;
					for(int i = 0; i < Event.edit.length; i++)
						CompositionEnd = str_utf8_forward(m_aComposition, CompositionEnd);
					m_CompositionSelectedLength = CompositionEnd - m_CompositionCursor;
					AddEvent(0, 0, IInput::FLAG_TEXT);
				}
				else
				{
					m_aComposition[0] = '\0';
					m_CompositionLength = 0;
					m_CompositionCursor = 0;
					m_CompositionSelectedLength = 0;
				}
				break;
			}
			case SDL_TEXTINPUT:
				m_aComposition[0] = 0;
				m_CompositionLength = COMP_LENGTH_INACTIVE;
				m_CompositionCursor = 0;
				m_CompositionSelectedLength = 0;
				AddEvent(Event.text.text, 0, IInput::FLAG_TEXT);
				break;

			// handle keys
			case SDL_KEYUP:
				Action = IInput::FLAG_RELEASE;

				// fall through
			case SDL_KEYDOWN:
				Key = KeycodeToKey(Event.key.keysym.sym);
				Scancode = Event.key.keysym.scancode;
				break;

			// handle the joystick events
			case SDL_JOYAXISMOTION:
				HandleJoystickAxisMotionEvent(Event);
				break;

			case SDL_JOYBUTTONUP:
			case SDL_JOYBUTTONDOWN:
				HandleJoystickButtonEvent(Event);
				break;

			case SDL_JOYHATMOTION:
				HandleJoystickHatMotionEvent(Event);
				break;

			// handle mouse buttons
			case SDL_MOUSEBUTTONUP:
				Action = IInput::FLAG_RELEASE;

				// fall through
			case SDL_MOUSEBUTTONDOWN:
				if(Event.button.button == SDL_BUTTON_LEFT) // ignore_convention
				{
					Key = KEY_MOUSE_1;
					if(Event.button.clicks%2 == 0)
						m_MouseDoubleClick = true;
					else if(Event.button.clicks == 1)
						m_MouseDoubleClick = false;
				}
				else if(Event.button.button == SDL_BUTTON_RIGHT) Key = KEY_MOUSE_2; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_MIDDLE) Key = KEY_MOUSE_3; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_X1) Key = KEY_MOUSE_4; // ignore_convention
				else if(Event.button.button == SDL_BUTTON_X2) Key = KEY_MOUSE_5; // ignore_convention
				else if(Event.button.button == 6) Key = KEY_MOUSE_6; // ignore_convention
				else if(Event.button.button == 7) Key = KEY_MOUSE_7; // ignore_convention
				else if(Event.button.button == 8) Key = KEY_MOUSE_8; // ignore_convention
				else if(Event.button.button == 9) Key = KEY_MOUSE_9; // ignore_convention
				Scancode = Key;
				break;

			case SDL_MOUSEWHEEL:
				if(Event.wheel.y > 0) Key = KEY_MOUSE_WHEEL_UP; // ignore_convention
				else if(Event.wheel.y < 0) Key = KEY_MOUSE_WHEEL_DOWN; // ignore_convention
				else break;
				Action |= IInput::FLAG_RELEASE;
				Scancode = Key;
				break;

#if defined(CONF_PLATFORM_MACOSX)	// Todo SDL: remove this when fixed (mouse state is faulty on start)
			case SDL_WINDOWEVENT:
				if(Event.window.event == SDL_WINDOWEVENT_MAXIMIZED)
				{
					MouseModeAbsolute();
					MouseModeRelative();
				}
				break;
#endif

			// other messages
			case SDL_QUIT:
				return 1;
		}

		if(Key >= 0 && !HasComposition())
		{
			if((Action&IInput::FLAG_PRESS) && Key < g_MaxKeys && Scancode >= 0 && Scancode < g_MaxKeys)
			{
				m_aInputState[Scancode] = true;
				m_aInputCount[Key] = m_InputCounter;
			}
			AddEvent(0, Key, Action);
		}
	}

	if(m_CompositionLength == 0)
		m_CompositionLength = COMP_LENGTH_INACTIVE;

	return 0;
}